

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O0

Qiniu_Error Qiniu_Qetag_Update(_Qiniu_Qetag_Context *ctx,char *buf,size_t bufSize)

{
  Qiniu_Error QVar1;
  size_t local_70;
  size_t copySize;
  size_t size;
  char *pos;
  size_t bufSize_local;
  char *buf_local;
  _Qiniu_Qetag_Context *ctx_local;
  Qiniu_Error err;
  
  copySize = bufSize;
  size = (size_t)buf;
  while (copySize != 0) {
    if (ctx->blk == (Qiniu_Qetag_Block *)0x0) {
      QVar1 = Qiniu_Qetag_allocateBlock(ctx,&ctx->blk);
      err._0_8_ = QVar1.message;
      ctx_local = (_Qiniu_Qetag_Context *)(ulong)(uint)QVar1.code;
      if (QVar1.code != 200) goto LAB_0011b7d1;
    }
    if (copySize < ((uint)ctx->blk->field_0 & 0x7fffff)) {
      local_70 = copySize;
    }
    else {
      local_70 = (size_t)((uint)ctx->blk->field_0 & 0x7fffff);
    }
    if (local_70 != 0) {
      QVar1 = Qiniu_Qetag_UpdateBlock(ctx->blk,(char *)size,local_70,(size_t *)0x0);
      err._0_8_ = QVar1.message;
      ctx_local = (_Qiniu_Qetag_Context *)(ulong)(uint)QVar1.code;
      if (QVar1.code != 200) goto LAB_0011b7d1;
      size = local_70 + size;
      copySize = copySize - local_70;
    }
    if (((uint)ctx->blk->field_0 & 0x7fffff) == 0) {
      Qiniu_Qetag_CommitBlock(ctx,ctx->blk);
      ctx->blk = (Qiniu_Qetag_Block *)0x0;
    }
  }
  ctx_local = (_Qiniu_Qetag_Context *)0xc8;
  err._0_8_ = anon_var_dwarf_bac7;
LAB_0011b7d1:
  QVar1.message = (char *)err._0_8_;
  QVar1._0_8_ = ctx_local;
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_Qetag_Update(struct _Qiniu_Qetag_Context * ctx, const char * buf, size_t bufSize)
{
    Qiniu_Error err;
    const char * pos = buf;
    size_t size = bufSize;
    size_t copySize = 0;

    while (size > 0) {
        if (!ctx->blk) {
            err = Qiniu_Qetag_allocateBlock(ctx, &ctx->blk);
            if (err.code != 200) {
                return err;
            }
        } // if

        copySize = (size >= ctx->blk->capacity) ? ctx->blk->capacity : size;
        if (copySize) {
            err = Qiniu_Qetag_UpdateBlock(ctx->blk, pos, copySize, NULL);
            if (err.code != 200) {
                return err;
            }

            pos += copySize;
            size -= copySize;
        } // if

        if (ctx->blk->capacity == 0) {
            Qiniu_Qetag_CommitBlock(ctx, ctx->blk);
            ctx->blk = NULL;
        } // if
    } // while

    err.code = 200;
    err.message = "ok";
    return err;
}